

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_byte
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype len)

{
  long lVar1;
  bool bVar2;
  enable_if_t<std::is_signed_v<long_long>,_bool> eVar3;
  qsizetype v1;
  const_iterator pcVar4;
  qint64 qVar5;
  QIODevice *in_RCX;
  QIODevice *__nbytes;
  QIODevice *in_RDX;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  qint64 skipped;
  bad_alloc *anon_var_0;
  qsizetype oldSize;
  char *ptr;
  qsizetype left;
  qsizetype toRead;
  qint64 actuallyRead;
  qsizetype newSize;
  CborError in_stack_ffffffffffffff5c;
  QCborStreamReaderPrivate *in_stack_ffffffffffffff60;
  qsizetype in_stack_ffffffffffffff68;
  QByteArray *in_stack_ffffffffffffff70;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 local_58;
  long local_50;
  QIODevice *local_48;
  QIODevice *local_28;
  qsizetype local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0;
  local_58.ptr = (char *)0x0;
  __nbytes = in_RCX;
  bVar2 = ReadStringChunk::isPlainPointer((ReadStringChunk *)&stack0xffffffffffffffe8);
  local_48 = in_RCX;
  if (bVar2) {
    local_50 = (long)in_RCX - (long)in_RDX;
    local_58 = in_RSI;
    local_48 = in_RDX;
    if (local_50 < 0) {
      local_50 = 0;
      local_48 = in_RCX;
    }
  }
  else {
    bVar2 = ReadStringChunk::isString((ReadStringChunk *)&stack0xffffffffffffffe8);
    if (!bVar2) {
      v1 = QByteArray::size(in_RSI.array);
      local_20 = v1;
      eVar3 = qAddOverflow<long_long>(v1,(longlong)in_RCX,&local_20);
      if (eVar3) {
        handleError(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        local_28 = (QIODevice *)0xffffffffffffffff;
        goto LAB_008da9ac;
      }
      QByteArray::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      pcVar4 = QByteArray::constBegin((QByteArray *)0x8da8b5);
      local_58.ptr = pcVar4 + v1;
    }
  }
  if (*in_RDI == 0) {
    local_28 = local_48;
    pcVar4 = QByteArray::constBegin((QByteArray *)0x8da984);
    memcpy(local_58.ptr,pcVar4 + in_RDI[0xd],(size_t)local_48);
  }
  else {
    local_28 = (QIODevice *)
               QIODevice::read((QIODevice *)*in_RDI,local_58._0_4_,local_48,(size_t)__nbytes);
    if (local_28 == local_48) {
      if ((local_50 != 0) && (qVar5 = QIODevice::skip(local_28,(qint64)in_RSI), qVar5 != local_50))
      {
        local_28 = (QIODevice *)0xffffffffffffffff;
      }
    }
    else {
      local_28 = (QIODevice *)0xffffffffffffffff;
    }
    if ((long)local_28 < 0) {
      handleError(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      local_28 = (QIODevice *)0xffffffffffffffff;
    }
  }
LAB_008da9ac:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (qsizetype)local_28;
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_byte(ReadStringChunk params, qsizetype len)
{
    qint64 actuallyRead;
    qsizetype toRead = qsizetype(len);
    qsizetype left = 0;     // bytes from the chunk not copied to the user buffer, to discard
    char *ptr = nullptr;

    if (params.isPlainPointer()) {
        left = toRead - params.maxlen_or_type;
        if (left < 0)
            left = 0;                           // buffer bigger than string
        else
            toRead = params.maxlen_or_type;     // buffer smaller than string
        ptr = params.ptr;
    } else if (!params.isString()) {
        // See note above on having ensured there is enough incoming data.
        auto oldSize = params.array->size();
        auto newSize = oldSize;
        if (qAddOverflow<decltype(newSize)>(oldSize, toRead, &newSize)) {
            handleError(CborErrorDataTooLarge);
            return -1;
        }
        QT_TRY {
            params.array->resize(newSize);
        } QT_CATCH (const std::bad_alloc &) {
            // the distinction between DataTooLarge and OOM is mostly for
            // compatibility with Qt 5; in Qt 6, we could consider everything
            // to be OOM.
            handleError(newSize > QByteArray::maxSize() ? CborErrorDataTooLarge: CborErrorOutOfMemory);
            return -1;
        }

        ptr = const_cast<char *>(params.array->constBegin()) + oldSize;
    }